

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

bool __thiscall soul::AST::TypeMetaFunction::isSizeOfUnsizedType(TypeMetaFunction *this)

{
  int iVar1;
  Type local_30;
  
  if ((this->operation == size) &&
     (iVar1 = (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
     (char)iVar1 != '\0')) {
    getSourceType(&local_30,this);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_30.structure.object);
    return local_30.boundingSize == 0 && local_30.category == array;
  }
  return false;
}

Assistant:

bool isSizeOfUnsizedType() const
        {
            return operation == Op::size && source->isResolved() && getSourceType().isUnsizedArray();
        }